

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::createBuffers(GLShaderProgram *this)

{
  pointer pGVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pGVar4;
  invalid_argument *this_00;
  long *plVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  GLint nAvailTextureUnits;
  int local_84;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*glad_glBindVertexArray)(this->vaoHandle);
  (*glad_glGetIntegerv)(0x8872,&local_84);
  pGVar1 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar4 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)pGVar1 - (long)pGVar4;
  if ((int)(uVar7 >> 4) * -0x33333333 <= local_84) {
    if (pGVar4 != pGVar1) {
      auVar9 = vpmovsxbd_avx512f(_DAT_00331810);
      auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar12 = vpmovsxwd_avx512f(_DAT_00527200);
      auVar13 = vpbroadcastd_avx512f(ZEXT416(0x10));
      uVar8 = 0;
      auVar14 = vpbroadcastq_avx512f();
      auVar14 = vpsrlq_avx512f(auVar14,6);
      do {
        auVar15 = vpbroadcastq_avx512f();
        uVar8 = uVar8 + 0x10;
        auVar16 = vporq_avx512f(auVar15,auVar10);
        auVar15 = vporq_avx512f(auVar15,auVar11);
        uVar2 = vpcmpuq_avx512f(auVar15,auVar14,2);
        uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
        vpscatterdd_avx512f(ZEXT864(pGVar4) + ZEXT864(0x24) + auVar12,
                            (ulong)CONCAT11((char)uVar3,(char)uVar2),auVar9);
        auVar9 = vpaddd_avx512f(auVar9,auVar13);
        pGVar4 = pGVar4 + 0x10;
      } while (((uVar7 - 0x50) / 0x50 + 0x10 & 0xfffffffffffffff0) != uVar8);
    }
    checkGLError(true);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_60,local_84);
  std::operator+(&local_40,
                 "Attempted to load more textures than the number of available texture units (",
                 &local_60);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar6 = plVar5 + 2;
  local_80 = (long *)*plVar5;
  if (local_80 == plVar6) {
    local_70 = *plVar6;
    lStack_68 = plVar5[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar6;
  }
  local_78 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::createBuffers() {
  bindVAO();

  // === Generate textures

  // Verify we have enough texture units
  GLint nAvailTextureUnits;
  glGetIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &nAvailTextureUnits);
  if ((int)textures.size() > nAvailTextureUnits) {
    throw std::invalid_argument("Attempted to load more textures than the number of available texture "
                                "units (" +
                                std::to_string(nAvailTextureUnits) + ").");
  }

  // Set indices sequentially
  uint32_t iTexture = 0;
  for (GLShaderTexture& t : textures) {
    t.index = iTexture++;
  }

  checkGLError();
}